

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

void OutputDebugStringA(char *pOut)

{
  int __fd;
  string strTmp;
  allocator<char> local_39;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  __fd = open("/tmp/dbgout",0x801);
  if (-1 < __fd) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pOut,&local_39);
    write(__fd,local_38,local_30);
    close(__fd);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void OutputDebugStringA(const char* pOut)
{   // mkfifo /tmp/dbgout  ->  tail -f /tmp/dbgout
    int fdPipe = open("/tmp/dbgout", O_WRONLY | O_NONBLOCK);
    if (fdPipe >= 0)
    {
        std::string strTmp(pOut);
        write(fdPipe, strTmp.c_str(), strTmp.size());
        close(fdPipe);
    }
}